

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O0

void ga_twist_accumulate(ga_twist *xd1,ga_twist *xd2,ga_twist *r)

{
  ga_twist *r_local;
  ga_twist *xd2_local;
  ga_twist *xd1_local;
  
  if (xd1 == (ga_twist *)0x0) {
    __assert_fail("xd1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0xb0,
                  "void ga_twist_accumulate(const struct ga_twist *, const struct ga_twist *, struct ga_twist *)"
                 );
  }
  if (xd2 == (ga_twist *)0x0) {
    __assert_fail("xd2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0xb1,
                  "void ga_twist_accumulate(const struct ga_twist *, const struct ga_twist *, struct ga_twist *)"
                 );
  }
  if (r == (ga_twist *)0x0) {
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0xb2,
                  "void ga_twist_accumulate(const struct ga_twist *, const struct ga_twist *, struct ga_twist *)"
                 );
  }
  if (xd1->frame == (frame *)0x0) {
    __assert_fail("xd1->frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0xb3,
                  "void ga_twist_accumulate(const struct ga_twist *, const struct ga_twist *, struct ga_twist *)"
                 );
  }
  if (xd2->frame == (frame *)0x0) {
    __assert_fail("xd2->frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0xb4,
                  "void ga_twist_accumulate(const struct ga_twist *, const struct ga_twist *, struct ga_twist *)"
                 );
  }
  if (xd1->frame->origin == (point *)0x0) {
    __assert_fail("xd1->frame->origin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0xb5,
                  "void ga_twist_accumulate(const struct ga_twist *, const struct ga_twist *, struct ga_twist *)"
                 );
  }
  if (xd2->frame->origin == (point *)0x0) {
    __assert_fail("xd2->frame->origin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0xb6,
                  "void ga_twist_accumulate(const struct ga_twist *, const struct ga_twist *, struct ga_twist *)"
                 );
  }
  if (xd1->point == xd1->frame->origin) {
    if (xd2->point != xd2->frame->origin) {
      __assert_fail("xd2->point == xd2->frame->origin",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                    ,0xb8,
                    "void ga_twist_accumulate(const struct ga_twist *, const struct ga_twist *, struct ga_twist *)"
                   );
    }
    if (xd1->target_body != xd2->reference_body) {
      __assert_fail("xd1->target_body == xd2->reference_body",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                    ,0xb9,
                    "void ga_twist_accumulate(const struct ga_twist *, const struct ga_twist *, struct ga_twist *)"
                   );
    }
    if (xd1->point != xd2->point) {
      __assert_fail("xd1->point == xd2->point",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                    ,0xba,
                    "void ga_twist_accumulate(const struct ga_twist *, const struct ga_twist *, struct ga_twist *)"
                   );
    }
    if (xd1->frame == xd2->frame) {
      r->target_body = xd2->target_body;
      r->reference_body = xd1->reference_body;
      r->point = xd1->point;
      r->frame = xd1->frame;
      return;
    }
    __assert_fail("xd1->frame == xd2->frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0xbb,
                  "void ga_twist_accumulate(const struct ga_twist *, const struct ga_twist *, struct ga_twist *)"
                 );
  }
  __assert_fail("xd1->point == xd1->frame->origin",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,0xb7,
                "void ga_twist_accumulate(const struct ga_twist *, const struct ga_twist *, struct ga_twist *)"
               );
}

Assistant:

void ga_twist_accumulate(
        const struct ga_twist *xd1,
        const struct ga_twist *xd2,
        struct ga_twist *r)
{
    assert(xd1);
    assert(xd2);
    assert(r);
    assert(xd1->frame);
    assert(xd2->frame);
    assert(xd1->frame->origin);
    assert(xd2->frame->origin);
    assert(xd1->point == xd1->frame->origin);       // screw twist
    assert(xd2->point == xd2->frame->origin);       // screw twist
    assert(xd1->target_body == xd2->reference_body);
    assert(xd1->point == xd2->point);
    assert(xd1->frame == xd2->frame);

    r->target_body = xd2->target_body;
    r->reference_body = xd1->reference_body;
    r->point = xd1->point;
    r->frame = xd1->frame;
}